

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool isInheritable(Property propertyId)

{
  Property propertyId_local;
  bool local_1;
  
  switch(propertyId) {
  case Font:
  case FontFamily:
  case FontSize:
  case FontStyle:
  case FontWeight:
  case TextIndent:
  case Whitespace:
  case ListStyleType:
  case ListStyle:
  case TextAlignment:
  case FontVariant:
  case TextTransform:
  case LineHeight:
  case FontKerning:
  case LetterSpacing:
  case WordSpacing:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool isInheritable(Property propertyId)
{
    switch (propertyId) {
    case Font:
    case FontKerning:
    case FontFamily:
    case FontSize:
    case FontStyle:
    case FontWeight:
    case TextIndent:
    case Whitespace:
    case ListStyleType:
    case ListStyle:
    case TextAlignment:
    case FontVariant:
    case TextTransform:
    case LineHeight:
    case LetterSpacing:
    case WordSpacing:
        return true;
    default:
        break;
    }
    return false;
}